

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O0

int run_test_tcp_read_stop_start(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_30 [8];
  sockaddr_in addr_1;
  sockaddr_in addr;
  uv_loop_t *loop;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)addr_1.sin_zero);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x6e,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_tcp_init(puVar2,&server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x70,"0 == uv_tcp_init(loop, &server)");
    abort();
  }
  iVar1 = uv_tcp_bind(&server,(sockaddr *)addr_1.sin_zero,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x72,"0 == uv_tcp_bind(&server, (struct sockaddr*) & addr, 0)");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&server,10,on_connection);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x74,"0 == uv_listen((uv_stream_t*)&server, 10, on_connection)");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_30);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x7a,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_tcp_init(puVar2,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x7c,"0 == uv_tcp_init(loop, &client)");
    abort();
  }
  iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)local_30,on_connect);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x7f,
            "0 == uv_tcp_connect(&connect_req, &client, (const struct sockaddr*) & addr, on_connect)"
           );
    abort();
  }
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x82,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (read_cb_called < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x84,"read_cb_called >= 2");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x86,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_read_stop_start) {
  uv_loop_t* loop = uv_default_loop();

  { /* Server */
    struct sockaddr_in addr;

    ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

    ASSERT(0 == uv_tcp_init(loop, &server));

    ASSERT(0 == uv_tcp_bind(&server, (struct sockaddr*) & addr, 0));

    ASSERT(0 == uv_listen((uv_stream_t*)&server, 10, on_connection));
  }

  { /* Client */
    struct sockaddr_in addr;

    ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

    ASSERT(0 == uv_tcp_init(loop, &client));

    ASSERT(0 == uv_tcp_connect(&connect_req, &client,
                               (const struct sockaddr*) & addr, on_connect));
  }

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(read_cb_called >= 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}